

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O0

bool lf::mesh::hybrid2d::test::mesh_sanity_check(Mesh *mesh)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  Message *message;
  char *message_00;
  size_type sVar5;
  undefined4 extraout_var;
  reference ppEVar6;
  undefined4 extraout_var_00;
  void *pvVar7;
  allocator<char> local_141;
  string local_140;
  RefEl local_119;
  string local_118;
  double local_f8;
  double vol;
  Entity *cell;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  double total_area;
  string local_b0;
  reference local_90;
  pair<lf::base::RefEl,_unsigned_int> *geo_errs;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  *__range4;
  Message local_68 [3];
  int local_4c;
  size_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  fails;
  Mesh *mesh_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Mesh sanity: Checking entity indexing");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_utils::checkEntityIndexing(mesh);
  poVar4 = std::operator<<((ostream *)&std::cout,"Mesh sanity: Checking mesh completeness");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_utils::checkMeshCompleteness(mesh);
  poVar4 = std::operator<<((ostream *)&std::cout,"Mesh sanity: Checking geometry compatibility: ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  this = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
         test_utils::WatertightLogger();
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this);
  spdlog::logger::set_level(this_00,trace);
  test_utils::isWatertightMesh
            ((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
              *)&gtest_ar.message_,mesh,false);
  local_48 = std::
             vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             ::size((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                     *)&gtest_ar.message_);
  local_4c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_40,"fails.size()","0",&local_48,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::Message::operator<<(local_68,(char (*) [23])"Inconsistent geometry!");
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x20,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range4,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range4);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  sVar5 = std::
          vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
          ::size((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                  *)&gtest_ar.message_);
  if (sVar5 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"consistent!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
    iVar2 = (*mesh->_vptr_Mesh[2])(mesh,0);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    cell = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while (bVar1 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&cell), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end3);
      vol = (double)*ppEVar6;
      iVar2 = (*((Entity *)vol)->_vptr_Entity[3])();
      local_f8 = lf::geometry::Volume((Geometry *)CONCAT44(extraout_var_00,iVar2));
      local_119.type_ = (**(code **)(*(long *)vol + 0x20))();
      lf::base::RefEl::ToString_abi_cxx11_(&local_118,&local_119);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_118);
      poVar4 = std::operator<<(poVar4,' ');
      uVar3 = (*mesh->_vptr_Mesh[5])(mesh,vol);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      poVar4 = std::operator<<(poVar4,": volume = ");
      pvVar7 = (void *)std::ostream::operator<<(poVar4,local_f8);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_118);
      __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                 (local_f8 + (double)__range3);
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,">>> Total area = ");
    pvVar7 = (void *)std::ostream::operator<<(poVar4,(double)__range3);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Mesh sanity: Writing MATLAB file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"test_mesh.m",&local_141);
    io::writeMatlab(mesh,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    utils::PrintInfo((ostream *)&std::cout,mesh,0x14);
    mesh_local._7_1_ = true;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"INCONSISTENT!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __end4 = std::
             vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             ::begin((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                      *)&gtest_ar.message_);
    geo_errs = (pair<lf::base::RefEl,_unsigned_int> *)
               std::
               vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
               ::end((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
                      *)&gtest_ar.message_);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<lf::base::RefEl,_unsigned_int>_*,_std::vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>_>
                             (&__end4,(__normal_iterator<std::pair<lf::base::RefEl,_unsigned_int>_*,_std::vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>_>
                                       *)&geo_errs), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_90 = __gnu_cxx::
                 __normal_iterator<std::pair<lf::base::RefEl,_unsigned_int>_*,_std::vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>_>
                 ::operator*(&__end4);
      lf::base::RefEl::ToString_abi_cxx11_(&local_b0,&local_90->first);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_b0);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_90->second);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_b0);
      __gnu_cxx::
      __normal_iterator<std::pair<lf::base::RefEl,_unsigned_int>_*,_std::vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>_>
      ::operator++(&__end4);
    }
    mesh_local._7_1_ = false;
  }
  std::
  vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
  ::~vector((vector<std::pair<lf::base::RefEl,_unsigned_int>,_std::allocator<std::pair<lf::base::RefEl,_unsigned_int>_>_>
             *)&gtest_ar.message_);
  return mesh_local._7_1_;
}

Assistant:

bool mesh_sanity_check(const lf::mesh::Mesh& mesh) {
  std::cout << "Mesh sanity: Checking entity indexing" << std::endl;
  test_utils::checkEntityIndexing(mesh);

  std::cout << "Mesh sanity: Checking mesh completeness" << std::endl;
  test_utils::checkMeshCompleteness(mesh);

  std::cout << "Mesh sanity: Checking geometry compatibility: " << std::flush;
  lf::mesh::test_utils::WatertightLogger()->set_level(spdlog::level::trace);
  auto fails = lf::mesh::test_utils::isWatertightMesh(mesh, false);
  EXPECT_EQ(fails.size(), 0) << "Inconsistent geometry!";
  if (fails.size() == 0) {
    std::cout << "consistent!" << std::endl;
  } else {
    std::cout << "INCONSISTENT!" << std::endl;
    for (auto& geo_errs : fails) {
      std::cout << geo_errs.first.ToString() << "(" << geo_errs.second << ")"
                << std::endl;
    }
    return false;
  }

  // Compute volumes
  double total_area = 0.0;
  for (const mesh::Entity* cell : mesh.Entities(0)) {
    const double vol = Volume(*cell->Geometry());
    std::cout << cell->RefEl().ToString() << ' ' << mesh.Index(*cell)
              << ": volume = " << vol << std::endl;
    total_area += vol;
  }
  std::cout << ">>> Total area = " << total_area << std::endl;

  std::cout << "Mesh sanity: Writing MATLAB file" << std::endl;
  io::writeMatlab(mesh, "test_mesh.m");

  // Printing mesh information
  utils::PrintInfo(std::cout, mesh, 20);
  return true;
}